

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall pbrt::SpotLight::Phi(SpotLight *this,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  long in_RDI;
  undefined1 auVar9 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  SampledSpectrum SVar16;
  undefined4 in_stack_ffffffffffffff88;
  Float in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  Float a;
  SampledWavelengths *in_stack_ffffffffffffffa8;
  DenselySampledSpectrum *in_stack_ffffffffffffffb0;
  
  auVar15 = in_ZMM1._8_56_;
  a = *(Float *)(in_RDI + 0xc0);
  auVar9 = (undefined1  [56])0x0;
  SVar16 = DenselySampledSpectrum::Sample(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  auVar10._0_8_ = SVar16.values.values._8_8_;
  auVar10._8_56_ = auVar15;
  auVar4._0_8_ = SVar16.values.values._0_8_;
  auVar4._8_56_ = auVar9;
  auVar9 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar4._0_16_);
  vmovlpd_avx(auVar10._0_16_);
  SVar16 = pbrt::operator*(a,(SampledSpectrum *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  auVar11._0_8_ = SVar16.values.values._8_8_;
  auVar11._8_56_ = auVar15;
  auVar5._0_8_ = SVar16.values.values._0_8_;
  auVar5._8_56_ = auVar9;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar11._0_16_);
  auVar9 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*
                     ((SampledSpectrum *)CONCAT44(a,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
  auVar12._0_8_ = SVar16.values.values._8_8_;
  auVar12._8_56_ = auVar15;
  auVar6._0_8_ = SVar16.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  vmovlpd_avx(auVar6._0_16_);
  vmovlpd_avx(auVar12._0_16_);
  auVar9 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*
                     ((SampledSpectrum *)CONCAT44(a,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
  auVar13._0_8_ = SVar16.values.values._8_8_;
  auVar13._8_56_ = auVar15;
  auVar7._0_8_ = SVar16.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar13._0_16_);
  auVar15 = (undefined1  [56])0x0;
  auVar9 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*
                     ((SampledSpectrum *)CONCAT44(a,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
  auVar14._0_8_ = SVar16.values.values._8_8_;
  auVar14._8_56_ = auVar15;
  auVar8._0_8_ = SVar16.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  uVar2 = vmovlpd_avx(auVar14._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum SpotLight::Phi(const SampledWavelengths &lambda) const {
    // int_0^start sin theta dtheta = 1 - cosFalloffStart
    // See notes/sample-spotlight.nb for the falloff part:
    // int_start^end smoothstep(cost, end, start) sin theta dtheta =
    //  (cosStart - cosEnd) / 2
    return scale * I.Sample(lambda) * 2 * Pi *
           ((1 - cosFalloffStart) + (cosFalloffStart - cosFalloffEnd) / 2);
}